

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

int __thiscall QPainterState::init(QPainterState *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  QBrushData *pQVar2;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  QFontPrivate *pQVar4;
  QPainterPathPrivate *pQVar5;
  QColor color;
  LayoutDirection LVar6;
  long in_FS_OFFSET;
  QColor local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QColor::QColor(&local_40,white);
  color.ct._4_4_ = local_40.ct._4_4_;
  color._0_8_ = local_40._0_8_;
  color._12_4_ = local_40._12_4_;
  QBrush::operator=(&this->bgBrush,color);
  this->bgMode = TransparentMode;
  this->field_0x1a0 = this->field_0x1a0 & 0xf8 | 4;
  this->wx = 0;
  this->wy = 0;
  this->ww = 0;
  this->wh = 0;
  this->vx = 0;
  this->vy = 0;
  this->vw = 0;
  this->vh = 0;
  this->painter = (QPainter *)ctx;
  QPen::QPen((QPen *)&local_40);
  pQVar2 = (QBrushData *)(this->pen).d.d.ptr;
  (this->pen).d.d.ptr = (QPenPrivate *)local_40._0_8_;
  local_40._0_8_ = pQVar2;
  QPen::~QPen((QPen *)&local_40);
  (this->brushOrigin).xp = 0.0;
  (this->brushOrigin).yp = 0.0;
  QBrush::QBrush((QBrush *)&local_40);
  _Var3._M_head_impl =
       (this->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  (this->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_40._0_8_;
  local_40._0_8_ = _Var3._M_head_impl;
  QBrush::~QBrush((QBrush *)&local_40);
  QFont::QFont((QFont *)&local_40);
  pQVar4 = (this->deviceFont).d.d.ptr;
  (this->deviceFont).d.d.ptr = (QFontPrivate *)local_40._0_8_;
  uVar1 = (this->deviceFont).resolve_mask;
  (this->deviceFont).resolve_mask = local_40.ct._4_4_;
  local_40._0_8_ = pQVar4;
  local_40.ct._4_4_ = uVar1;
  QFont::operator=(&this->font,&this->deviceFont);
  QFont::~QFont((QFont *)&local_40);
  QRegion::QRegion((QRegion *)&local_40);
  pQVar5 = (QPainterPathPrivate *)(this->clipRegion).d;
  (this->clipRegion).d = (QRegionData *)local_40._0_8_;
  local_40._0_8_ = pQVar5;
  QRegion::~QRegion((QRegion *)&local_40);
  QPainterPath::QPainterPath((QPainterPath *)&local_40);
  pQVar5 = (this->clipPath).d_ptr.d.ptr;
  (this->clipPath).d_ptr.d.ptr = (QPainterPathPrivate *)local_40._0_8_;
  local_40._0_8_ = pQVar5;
  QPainterPath::~QPainterPath((QPainterPath *)&local_40);
  this->clipOperation = NoClip;
  QList<QPainterClipInfo>::clear(&this->clipInfo);
  QTransform::reset(&this->worldMatrix);
  QTransform::reset(&this->matrix);
  LVar6 = QGuiApplication::layoutDirection();
  this->layoutDirection = LVar6;
  this->composition_mode = CompositionMode_SourceOver;
  this->emulationSpecifier = 0;
  (this->super_QPaintEngineState).dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
  this->changeFlags = 0;
  (this->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
  super_QFlagsStorage<QPainter::RenderHint>.i = 0;
  this->opacity = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPainterState::init(QPainter *p) {
    bgBrush = Qt::white;
    bgMode = Qt::TransparentMode;
    WxF = false;
    VxF = false;
    clipEnabled = true;
    wx = wy = ww = wh = 0;
    vx = vy = vw = vh = 0;
    painter = p;
    pen = QPen();
    brushOrigin = QPointF(0, 0);
    brush = QBrush();
    font = deviceFont = QFont();
    clipRegion = QRegion();
    clipPath = QPainterPath();
    clipOperation = Qt::NoClip;
    clipInfo.clear();
    worldMatrix.reset();
    matrix.reset();
    layoutDirection = QGuiApplication::layoutDirection();
    composition_mode = QPainter::CompositionMode_SourceOver;
    emulationSpecifier = 0;
    dirtyFlags = { };
    changeFlags = 0;
    renderHints = { };
    opacity = 1;
}